

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelbc.cpp
# Opt level: O0

void __thiscall TPZGeoElBC::TPZGeoElBC(TPZGeoElBC *this,TPZGeoElSide *elside,int matid)

{
  int iVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined4 in_EDX;
  TPZGeoElSide *in_RSI;
  undefined8 *in_RDI;
  int side;
  TPZGeoEl *el;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  
  *in_RDI = 0;
  pTVar3 = TPZGeoElSide::Element(in_RSI);
  iVar1 = TPZGeoElSide::Side(in_RSI);
  iVar2 = (**(code **)(*(long *)pTVar3 + 0x140))(pTVar3,iVar1);
  if (iVar2 != 0) {
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  if ((pTVar3 == (TPZGeoEl *)0x0) || (iVar1 == -1)) {
    if (pTVar3 == (TPZGeoEl *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error at ");
      poVar4 = std::operator<<(poVar4,"TPZGeoElBC::TPZGeoElBC(const TPZGeoElSide &, int)");
      std::operator<<(poVar4," - TPZGeoEl *elside.Element() is NULL\n");
    }
    if (iVar1 == -1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error at ");
      poVar4 = std::operator<<(poVar4,"TPZGeoElBC::TPZGeoElBC(const TPZGeoElSide &, int)");
      std::operator<<(poVar4," - int elside.Side() is -1\n");
    }
  }
  else {
    uVar5 = (**(code **)(*(long *)pTVar3 + 0x170))(pTVar3,iVar1,in_EDX);
    *in_RDI = uVar5;
  }
  return;
}

Assistant:

TPZGeoElBC::TPZGeoElBC(const TPZGeoElSide &elside,int matid):fCreatedElement(NULL){
	TPZGeoEl * el = elside.Element();
	const int side = elside.Side();
	if(el->SideIsUndefined(side)) //Verify if the connectivity was made before the creation of the bc
	{
		DebugStop();
	}
	if (!el || side == -1){
		if (!el) PZError << "Error at " << __PRETTY_FUNCTION__ << " - TPZGeoEl *elside.Element() is NULL\n";
		if (side == -1) PZError << "Error at " << __PRETTY_FUNCTION__ << " - int elside.Side() is -1\n";
		return;
	}
	this->fCreatedElement = el->CreateBCGeoEl( side, matid );
}